

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O0

btbb_piconet * btbb_next_survey_result(void)

{
  survey_hash *__ptr;
  survey_hash *tmp;
  btbb_piconet *pn;
  
  __ptr = piconet_survey;
  tmp = (survey_hash *)0x0;
  if (piconet_survey != (survey_hash *)0x0) {
    tmp = (survey_hash *)piconet_survey->pn;
    piconet_survey = (survey_hash *)(piconet_survey->hh).next;
    free(__ptr);
  }
  return (btbb_piconet *)tmp;
}

Assistant:

btbb_piconet *btbb_next_survey_result() {
	btbb_piconet *pn = NULL;
	survey_hash *tmp;

	if (piconet_survey != NULL) {
		pn = piconet_survey->pn;
		tmp = piconet_survey;
		piconet_survey = piconet_survey->hh.next;
		free(tmp);
	}
	return pn;
}